

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O0

void kokkosp_begin_deep_copy
               (SpaceHandle dst_handle,char *dst_name,void *dst_ptr,SpaceHandle src_handle,
               char *src_name,void *src_ptr,uint64_t size)

{
  SpaceHandle dst_handle_00;
  SpaceHandle src_handle_00;
  char *dst_ptr_00;
  void *dst_name_00;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  uint64_t local_30;
  uint64_t size_local;
  void *src_ptr_local;
  char *src_name_local;
  void *dst_ptr_local;
  char *dst_name_local;
  
  local_30 = size;
  size_local = (uint64_t)src_ptr;
  src_ptr_local = src_name;
  src_name_local = (char *)dst_ptr;
  dst_ptr_local = dst_name;
  memcpy(&local_70,&dst_handle,0x40);
  dst_name_00 = dst_ptr_local;
  dst_ptr_00 = src_name_local;
  memcpy(&local_b0,&src_handle,0x40);
  dst_handle_00.name[8] = (undefined1)uStack_68;
  dst_handle_00.name[9] = uStack_68._1_1_;
  dst_handle_00.name[10] = uStack_68._2_1_;
  dst_handle_00.name[0xb] = uStack_68._3_1_;
  dst_handle_00.name[0xc] = uStack_68._4_1_;
  dst_handle_00.name[0xd] = uStack_68._5_1_;
  dst_handle_00.name[0xe] = uStack_68._6_1_;
  dst_handle_00.name[0xf] = uStack_68._7_1_;
  dst_handle_00.name[0] = (undefined1)local_70;
  dst_handle_00.name[1] = local_70._1_1_;
  dst_handle_00.name[2] = local_70._2_1_;
  dst_handle_00.name[3] = local_70._3_1_;
  dst_handle_00.name[4] = local_70._4_1_;
  dst_handle_00.name[5] = local_70._5_1_;
  dst_handle_00.name[6] = local_70._6_1_;
  dst_handle_00.name[7] = local_70._7_1_;
  dst_handle_00.name[0x10] = (undefined1)local_60;
  dst_handle_00.name[0x11] = local_60._1_1_;
  dst_handle_00.name[0x12] = local_60._2_1_;
  dst_handle_00.name[0x13] = local_60._3_1_;
  dst_handle_00.name[0x14] = local_60._4_1_;
  dst_handle_00.name[0x15] = local_60._5_1_;
  dst_handle_00.name[0x16] = local_60._6_1_;
  dst_handle_00.name[0x17] = local_60._7_1_;
  dst_handle_00.name[0x18] = (undefined1)uStack_58;
  dst_handle_00.name[0x19] = uStack_58._1_1_;
  dst_handle_00.name[0x1a] = uStack_58._2_1_;
  dst_handle_00.name[0x1b] = uStack_58._3_1_;
  dst_handle_00.name[0x1c] = uStack_58._4_1_;
  dst_handle_00.name[0x1d] = uStack_58._5_1_;
  dst_handle_00.name[0x1e] = uStack_58._6_1_;
  dst_handle_00.name[0x1f] = uStack_58._7_1_;
  dst_handle_00.name[0x20] = (undefined1)local_50;
  dst_handle_00.name[0x21] = local_50._1_1_;
  dst_handle_00.name[0x22] = local_50._2_1_;
  dst_handle_00.name[0x23] = local_50._3_1_;
  dst_handle_00.name[0x24] = local_50._4_1_;
  dst_handle_00.name[0x25] = local_50._5_1_;
  dst_handle_00.name[0x26] = local_50._6_1_;
  dst_handle_00.name[0x27] = local_50._7_1_;
  dst_handle_00.name[0x28] = (undefined1)uStack_48;
  dst_handle_00.name[0x29] = uStack_48._1_1_;
  dst_handle_00.name[0x2a] = uStack_48._2_1_;
  dst_handle_00.name[0x2b] = uStack_48._3_1_;
  dst_handle_00.name[0x2c] = uStack_48._4_1_;
  dst_handle_00.name[0x2d] = uStack_48._5_1_;
  dst_handle_00.name[0x2e] = uStack_48._6_1_;
  dst_handle_00.name[0x2f] = uStack_48._7_1_;
  dst_handle_00.name[0x30] = (undefined1)local_40;
  dst_handle_00.name[0x31] = local_40._1_1_;
  dst_handle_00.name[0x32] = local_40._2_1_;
  dst_handle_00.name[0x33] = local_40._3_1_;
  dst_handle_00.name[0x34] = local_40._4_1_;
  dst_handle_00.name[0x35] = local_40._5_1_;
  dst_handle_00.name[0x36] = local_40._6_1_;
  dst_handle_00.name[0x37] = local_40._7_1_;
  dst_handle_00.name[0x38] = (undefined1)uStack_38;
  dst_handle_00.name[0x39] = uStack_38._1_1_;
  dst_handle_00.name[0x3a] = uStack_38._2_1_;
  dst_handle_00.name[0x3b] = uStack_38._3_1_;
  dst_handle_00.name[0x3c] = uStack_38._4_1_;
  dst_handle_00.name[0x3d] = uStack_38._5_1_;
  dst_handle_00.name[0x3e] = uStack_38._6_1_;
  dst_handle_00.name[0x3f] = uStack_38._7_1_;
  src_handle_00.name[8] = (undefined1)uStack_a8;
  src_handle_00.name[9] = uStack_a8._1_1_;
  src_handle_00.name[10] = uStack_a8._2_1_;
  src_handle_00.name[0xb] = uStack_a8._3_1_;
  src_handle_00.name[0xc] = uStack_a8._4_1_;
  src_handle_00.name[0xd] = uStack_a8._5_1_;
  src_handle_00.name[0xe] = uStack_a8._6_1_;
  src_handle_00.name[0xf] = uStack_a8._7_1_;
  src_handle_00.name[0] = (undefined1)local_b0;
  src_handle_00.name[1] = local_b0._1_1_;
  src_handle_00.name[2] = local_b0._2_1_;
  src_handle_00.name[3] = local_b0._3_1_;
  src_handle_00.name[4] = local_b0._4_1_;
  src_handle_00.name[5] = local_b0._5_1_;
  src_handle_00.name[6] = local_b0._6_1_;
  src_handle_00.name[7] = local_b0._7_1_;
  src_handle_00.name[0x10] = (undefined1)local_a0;
  src_handle_00.name[0x11] = local_a0._1_1_;
  src_handle_00.name[0x12] = local_a0._2_1_;
  src_handle_00.name[0x13] = local_a0._3_1_;
  src_handle_00.name[0x14] = local_a0._4_1_;
  src_handle_00.name[0x15] = local_a0._5_1_;
  src_handle_00.name[0x16] = local_a0._6_1_;
  src_handle_00.name[0x17] = local_a0._7_1_;
  src_handle_00.name[0x18] = (undefined1)uStack_98;
  src_handle_00.name[0x19] = uStack_98._1_1_;
  src_handle_00.name[0x1a] = uStack_98._2_1_;
  src_handle_00.name[0x1b] = uStack_98._3_1_;
  src_handle_00.name[0x1c] = uStack_98._4_1_;
  src_handle_00.name[0x1d] = uStack_98._5_1_;
  src_handle_00.name[0x1e] = uStack_98._6_1_;
  src_handle_00.name[0x1f] = uStack_98._7_1_;
  src_handle_00.name[0x20] = (undefined1)local_90;
  src_handle_00.name[0x21] = local_90._1_1_;
  src_handle_00.name[0x22] = local_90._2_1_;
  src_handle_00.name[0x23] = local_90._3_1_;
  src_handle_00.name[0x24] = local_90._4_1_;
  src_handle_00.name[0x25] = local_90._5_1_;
  src_handle_00.name[0x26] = local_90._6_1_;
  src_handle_00.name[0x27] = local_90._7_1_;
  src_handle_00.name[0x28] = (undefined1)uStack_88;
  src_handle_00.name[0x29] = uStack_88._1_1_;
  src_handle_00.name[0x2a] = uStack_88._2_1_;
  src_handle_00.name[0x2b] = uStack_88._3_1_;
  src_handle_00.name[0x2c] = uStack_88._4_1_;
  src_handle_00.name[0x2d] = uStack_88._5_1_;
  src_handle_00.name[0x2e] = uStack_88._6_1_;
  src_handle_00.name[0x2f] = uStack_88._7_1_;
  src_handle_00.name[0x30] = (undefined1)local_80;
  src_handle_00.name[0x31] = local_80._1_1_;
  src_handle_00.name[0x32] = local_80._2_1_;
  src_handle_00.name[0x33] = local_80._3_1_;
  src_handle_00.name[0x34] = local_80._4_1_;
  src_handle_00.name[0x35] = local_80._5_1_;
  src_handle_00.name[0x36] = local_80._6_1_;
  src_handle_00.name[0x37] = local_80._7_1_;
  src_handle_00.name[0x38] = (undefined1)uStack_78;
  src_handle_00.name[0x39] = uStack_78._1_1_;
  src_handle_00.name[0x3a] = uStack_78._2_1_;
  src_handle_00.name[0x3b] = uStack_78._3_1_;
  src_handle_00.name[0x3c] = uStack_78._4_1_;
  src_handle_00.name[0x3d] = uStack_78._5_1_;
  src_handle_00.name[0x3e] = uStack_78._6_1_;
  src_handle_00.name[0x3f] = uStack_78._7_1_;
  KokkosTools::PerfettoConnector::kokkosp_begin_deep_copy
            (dst_handle_00,(char *)dst_name_00,dst_ptr_00,src_handle_00,(char *)src_ptr_local,
             (void *)size_local,local_30);
  return;
}

Assistant:

void kokkosp_begin_deep_copy(SpaceHandle dst_handle, const char *dst_name,
                             const void *dst_ptr, SpaceHandle src_handle,
                             const char *src_name, const void *src_ptr,
                             uint64_t size) {
  TRACE_EVENT_BEGIN("kokkos.deep_copy", nullptr,
                    [&](perfetto::EventContext ctx) {
                      std::stringstream _name;
                      _name << dst_name << "->" << src_name;
                      ctx.event()->set_name(_name.str());
                      add_annotation(ctx, "size", size);
                      add_annotation(ctx, "dest_type", dst_handle.name);
                      add_annotation(ctx, "src_type", src_handle.name);
                      add_annotation(ctx, "dest_address", dst_ptr);
                      add_annotation(ctx, "src_address", src_ptr);
                    });
}